

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void tcu::anon_unknown_74::floatToChannel(deUint8 *dst,float src,ChannelType type)

{
  uchar uVar1;
  deFloat16 dVar2;
  uint uVar3;
  deUint32 dVar4;
  
  switch(type) {
  case SNORM_INT8:
    src = src * 127.0;
  case SIGNED_INT8:
    uVar1 = convertSatRte<signed_char>(src);
    goto LAB_001ef380;
  case SNORM_INT16:
    src = src * 32767.0;
  case SIGNED_INT16:
    dVar2 = convertSatRte<short>(src);
    goto LAB_001ef39e;
  case SNORM_INT32:
    src = src * 2.1474836e+09;
  case SIGNED_INT32:
    uVar3 = convertSatRte<int>(src);
    goto LAB_001ef346;
  case UNORM_INT8:
    src = src * 255.0;
  case UNSIGNED_INT8:
    uVar1 = convertSatRte<unsigned_char>(src);
LAB_001ef380:
    *dst = uVar1;
    break;
  case UNORM_INT16:
    src = src * 65535.0;
  case UNSIGNED_INT16:
    dVar2 = convertSatRte<unsigned_short>(src);
    goto LAB_001ef39e;
  case UNORM_INT24:
    src = src * 16777215.0;
  case UNSIGNED_INT24:
    dVar4 = convertSatRteUint24(src);
    *dst = (deUint8)dVar4;
    dst[1] = (deUint8)(dVar4 >> 8);
    dst[2] = (deUint8)(dVar4 >> 0x10);
    break;
  case UNORM_INT32:
    src = src * 4.2949673e+09;
  case UNSIGNED_INT32:
    uVar3 = convertSatRte<unsigned_int>(src);
LAB_001ef346:
    *(uint *)dst = uVar3;
    break;
  case HALF_FLOAT:
    dVar2 = deFloat32To16(src);
LAB_001ef39e:
    *(deFloat16 *)dst = dVar2;
    break;
  case FLOAT:
    *(float *)dst = src;
    break;
  case FLOAT64:
    *(double *)dst = (double)src;
  }
  return;
}

Assistant:

void floatToChannel (deUint8* dst, float src, TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			*((deInt8*)dst)			= convertSatRte<deInt8>		(src * 127.0f);			break;
		case TextureFormat::SNORM_INT16:		*((deInt16*)dst)		= convertSatRte<deInt16>	(src * 32767.0f);		break;
		case TextureFormat::SNORM_INT32:		*((deInt32*)dst)		= convertSatRte<deInt32>	(src * 2147483647.0f);	break;
		case TextureFormat::UNORM_INT8:			*((deUint8*)dst)		= convertSatRte<deUint8>	(src * 255.0f);			break;
		case TextureFormat::UNORM_INT16:		*((deUint16*)dst)		= convertSatRte<deUint16>	(src * 65535.0f);		break;
		case TextureFormat::UNORM_INT24:		writeUint24(dst,		  convertSatRteUint24		(src * 16777215.0f));	break;
		case TextureFormat::UNORM_INT32:		*((deUint32*)dst)		= convertSatRte<deUint32>	(src * 4294967295.0f);	break;
		case TextureFormat::SIGNED_INT8:		*((deInt8*)dst)			= convertSatRte<deInt8>		(src);					break;
		case TextureFormat::SIGNED_INT16:		*((deInt16*)dst)		= convertSatRte<deInt16>	(src);					break;
		case TextureFormat::SIGNED_INT32:		*((deInt32*)dst)		= convertSatRte<deInt32>	(src);					break;
		case TextureFormat::UNSIGNED_INT8:		*((deUint8*)dst)		= convertSatRte<deUint8>	(src);					break;
		case TextureFormat::UNSIGNED_INT16:		*((deUint16*)dst)		= convertSatRte<deUint16>	(src);					break;
		case TextureFormat::UNSIGNED_INT24:		writeUint24(dst,		  convertSatRteUint24		(src));					break;
		case TextureFormat::UNSIGNED_INT32:		*((deUint32*)dst)		= convertSatRte<deUint32>	(src);					break;
		case TextureFormat::HALF_FLOAT:			*((deFloat16*)dst)		= deFloat32To16				(src);					break;
		case TextureFormat::FLOAT:				*((float*)dst)			= src;												break;
		case TextureFormat::FLOAT64:			*((double*)dst)			= (double)src;										break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}